

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O1

void __thiscall xercesc_4_0::TraverseSchema::traverseImport(TraverseSchema *this,DOMElement *elem)

{
  SchemaInfo *pSVar1;
  RefHashTableBucketElem<xercesc_4_0::SchemaInfo> *pRVar2;
  RefHashTableBucketElem<xercesc_4_0::SchemaInfo> *pRVar3;
  SchemaInfo *toRestore;
  NamespaceScopeManager nsMgr;
  NamespaceScopeManager local_28;
  
  pSVar1 = this->fSchemaInfo;
  if (elem == (DOMElement *)0x0) {
    local_28.fScopeAdded = false;
  }
  else {
    local_28.fScopeAdded = retrieveNamespaceMapping(this,elem);
  }
  pRVar2 = this->fPreprocessedNodes->fBucketList
           [(ulong)elem % this->fPreprocessedNodes->fHashModulus];
  pRVar3 = (RefHashTableBucketElem<xercesc_4_0::SchemaInfo> *)0x0;
  if (pRVar2 != (RefHashTableBucketElem<xercesc_4_0::SchemaInfo> *)0x0) {
    do {
      pRVar3 = pRVar2;
      if ((DOMElement *)pRVar2->fKey == elem) break;
      pRVar2 = pRVar2->fNext;
      pRVar3 = (RefHashTableBucketElem<xercesc_4_0::SchemaInfo> *)0x0;
    } while (pRVar2 != (RefHashTableBucketElem<xercesc_4_0::SchemaInfo> *)0x0);
  }
  if (pRVar3 == (RefHashTableBucketElem<xercesc_4_0::SchemaInfo> *)0x0) {
    toRestore = (SchemaInfo *)0x0;
  }
  else {
    toRestore = pRVar3->fData;
  }
  local_28.fSchemaInfo = pSVar1;
  if (toRestore != (SchemaInfo *)0x0) {
    pSVar1 = this->fSchemaInfo;
    restoreSchemaInfo(this,toRestore,IMPORT,0xfffffffe);
    doTraverseSchema(this,toRestore->fSchemaRootElement);
    restoreSchemaInfo(this,pSVar1,IMPORT,0xfffffffe);
  }
  NamespaceScopeManager::~NamespaceScopeManager(&local_28);
  return;
}

Assistant:

void TraverseSchema::traverseImport(const DOMElement* const elem) {

    NamespaceScopeManager nsMgr(elem, fSchemaInfo, this);

    SchemaInfo* importInfo = fPreprocessedNodes->get(elem);

    if (importInfo) {

        // --------------------------------------------------------
        // Traverse new schema
        // --------------------------------------------------------
        SchemaInfo* saveInfo = fSchemaInfo;

        restoreSchemaInfo(importInfo, SchemaInfo::IMPORT);
        doTraverseSchema(importInfo->getRoot());

        // --------------------------------------------------------
        // Restore old schema information
        // --------------------------------------------------------
        restoreSchemaInfo(saveInfo, SchemaInfo::IMPORT);
    }
}